

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
* __thiscall
helics::BrokerBase::processBaseCommands
          (pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           *__return_storage_ptr__,BrokerBase *this,ActionMessage *command)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  GlobalFederateId federateID;
  string_viewOps *__n_00;
  byte *__s;
  size_t __n_01;
  char *pcVar5;
  ulong uVar6;
  utilities *puVar7;
  string_view quoteChars;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view level;
  pointer pbVar8;
  int iVar9;
  LogLevels level_00;
  void *pvVar10;
  string *psVar11;
  unsigned_long newSize;
  int defValue;
  string_viewOps *psVar12;
  uint *defValue_00;
  element_type *peVar13;
  size_type __rlen;
  size_type __n;
  size_type __rlen_6;
  string_view V;
  string_view V_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view trimCharacters;
  string_view line;
  string_view str;
  string_view str_00;
  string_viewVector res;
  ActionMessage udisconnect;
  size_t sVar14;
  char *pcVar15;
  string_viewOps *local_140;
  byte *local_138;
  string_viewVector local_130;
  size_t local_118;
  byte *pbStack_110;
  undefined8 local_108;
  char *pcStack_100;
  undefined8 local_f8;
  char *pcStack_f0;
  undefined1 local_e8 [16];
  pointer local_d8;
  
  __n_00 = (string_viewOps *)(command->payload).bufferSize;
  __s = (command->payload).heap;
  local_140 = __n_00;
  local_138 = __s;
  if (__n_00 == (string_viewOps *)0x0) {
    psVar12 = (string_viewOps *)0xffffffffffffffff;
  }
  else {
    pvVar10 = memchr(__s,0x23,(size_t)__n_00);
    psVar12 = (string_viewOps *)(-(ulong)(pvVar10 == (void *)0x0) | (long)pvVar10 - (long)__s);
  }
  if ((psVar12 != (string_viewOps *)0xffffffffffffffff) &&
     (psVar12 = psVar12 + -1, local_140 = psVar12, local_138 = __s, __n_00 < psVar12)) {
    psVar12 = __n_00;
    local_140 = __n_00;
  }
  trimCharacters._M_str = (char *)psVar12;
  trimCharacters._M_len = (size_t)" \t\n\r";
  gmlc::utilities::string_viewOps::trimString
            ((string_viewOps *)&local_140,(string_view *)0x4,trimCharacters);
  sVar14 = 3;
  pcVar15 = (char *)0x447f49;
  quoteChars._M_str = (char *)0x447f49;
  quoteChars._M_len = 3;
  line._M_str = (char *)0x2;
  line._M_len = (size_t)local_138;
  gmlc::utilities::string_viewOps::splitlineQuotes
            (&local_130,local_140,line,(string_view)ZEXT816(0x43c0c1),quoteChars,
             (delimiter_compression)this);
  pbVar8 = local_130.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_130.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_130.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_e8 = (undefined1  [16])0x0;
    local_d8 = (pointer)0x0;
    __return_storage_ptr__->first = true;
    CLI::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&__return_storage_ptr__->second,
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_e8);
    if ((pointer)local_e8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_e8._0_8_,(long)local_d8 - local_e8._0_8_);
    }
    goto LAB_0030085e;
  }
  __n_01 = (local_130.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_len;
  if (__n_01 - 3 < 7) {
    pcVar5 = (local_130.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_str;
    defValue_00 = &switchD_00300427::switchdataD_004501d8;
    switch(__n_01) {
    case 3:
switchD_00300427_caseD_3:
      iVar9 = bcmp(pcVar5,"log",__n_01);
      if (iVar9 == 0) {
        if (5 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
          federateID.gid = (this->global_broker_id_local).gid;
          psVar11 = ActionMessage::getString_abi_cxx11_(command,1);
          uVar6 = (command->payload).bufferSize;
          if (uVar6 < 4) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",4);
          }
          local_118 = uVar6 - 4;
          pbStack_110 = (command->payload).heap + 4;
          message._M_str = (char *)pbStack_110;
          message._M_len = local_118;
          name._M_str = (psVar11->_M_dataplus)._M_p;
          name._M_len = psVar11->_M_string_length;
          sendToLogger(this,federateID,6,name,message,false);
        }
LAB_0030084d:
        __return_storage_ptr__->first = true;
        CLI::std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::vector(&__return_storage_ptr__->second,&local_130);
        goto LAB_0030085e;
      }
      if (__n_01 != 9) break;
LAB_00300522:
      iVar9 = bcmp(pcVar5,"logbuffer",__n_01);
      if (iVar9 == 0) {
        if (0x10 < (ulong)((long)local_130.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
          puVar7 = (utilities *)pbVar8[1]._M_len;
          pcVar15 = pbVar8[1]._M_str;
          if ((puVar7 != (utilities *)0x4) || (iVar9 = bcmp(pcVar15,"stop",4), iVar9 != 0)) {
            peVar13 = (this->mLogManager).
                      super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            V._M_str = (char *)0xa;
            V._M_len = (size_t)pcVar15;
            newSize = gmlc::utilities::numeric_conversion<unsigned_long>
                                (puVar7,V,(unsigned_long)defValue_00);
            LogBuffer::resize(&peVar13->mLogBuffer,newSize);
            goto LAB_0030084d;
          }
        }
        LogBuffer::enable(&((this->mLogManager).
                            super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->mLogBuffer,
                          (ulong)((long)local_130.
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) <
                          0x11);
        goto LAB_0030084d;
      }
      if (__n_01 == 9) {
        iVar9 = bcmp(pcVar5,"remotelog",9);
        defValue = (int)defValue_00;
        if (iVar9 == 0) {
          if ((ulong)((long)local_130.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x11) {
            peVar13 = (this->mLogManager).
                      super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar9 = peVar13->consoleLogLevel;
LAB_0030080e:
            LogManager::updateRemote(peVar13,(GlobalFederateId)(command->source_id).gid,iVar9);
          }
          else {
            puVar7 = (utilities *)pbVar8[1]._M_len;
            pcVar5 = pbVar8[1]._M_str;
            if ((puVar7 == (utilities *)0x4) && (iVar9 = bcmp(pcVar5,"stop",4), iVar9 == 0)) {
              peVar13 = (this->mLogManager).
                        super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              iVar9 = -4;
              goto LAB_0030080e;
            }
            if ((int)*pcVar5 - 0x30U < 10) {
              V_00._M_str = (char *)0xfffffffc;
              V_00._M_len = (size_t)pcVar5;
              level_00 = gmlc::utilities::numeric_conversion<int>(puVar7,V_00,defValue);
            }
            else {
              level._M_str = pcVar15;
              level._M_len = sVar14;
              level_00 = logLevelFromString(level);
            }
            LogManager::updateRemote
                      ((this->mLogManager).
                       super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (GlobalFederateId)(command->source_id).gid,level_00);
          }
          LOCK();
          (this->maxLogLevel).super___atomic_base<int>._M_i =
               (((this->mLogManager).
                 super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               maxLogLevel).super___atomic_base<int>._M_i;
          UNLOCK();
          goto LAB_0030084d;
        }
      }
      break;
    case 4:
switchD_00300427_caseD_4:
      iVar9 = bcmp(pcVar5,"echo",__n_01);
      if (iVar9 == 0) {
        if (5 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
          local_108 = 0x2e;
          pcStack_100 = " received echo command via command instruction";
          message_00._M_str = " received echo command via command instruction";
          message_00._M_len = 0x2e;
          name_00._M_str = (this->identifier)._M_dataplus._M_p;
          name_00._M_len = (this->identifier)._M_string_length;
          sendToLogger(this,(GlobalFederateId)(this->global_broker_id_local).gid,6,name_00,
                       message_00,false);
        }
        uVar1 = command->source_id;
        uVar2 = command->source_handle;
        uVar3 = command->dest_id;
        uVar4 = command->dest_handle;
        command->source_id = (GlobalFederateId)uVar3;
        command->source_handle = (InterfaceHandle)uVar4;
        command->dest_id = (GlobalFederateId)uVar1;
        command->dest_handle = (InterfaceHandle)uVar2;
        SmallBuffer::operator=(&command->payload,(char (*) [11])"echo_reply");
        psVar11 = ActionMessage::getString_abi_cxx11_(command,1);
        str._M_str = (psVar11->_M_dataplus)._M_p;
        str._M_len = psVar11->_M_string_length;
        ActionMessage::setString(command,0,str);
        str_00._M_str = (this->identifier)._M_dataplus._M_p;
        str_00._M_len = (this->identifier)._M_string_length;
        ActionMessage::setString(command,1,str_00);
        addActionMessage(this,command);
        goto LAB_0030084d;
      }
      if (__n_01 == 9) goto LAB_00300522;
      if (__n_01 == 3) goto switchD_00300427_caseD_3;
      break;
    case 6:
      iVar9 = bcmp(pcVar5,"ignore",__n_01);
      if (iVar9 == 0) goto LAB_0030084d;
      if (__n_01 == 3) goto switchD_00300427_caseD_3;
      if (__n_01 == 4) goto switchD_00300427_caseD_4;
      if (__n_01 == 9) goto switchD_00300427_caseD_9;
      break;
    case 9:
switchD_00300427_caseD_9:
      iVar9 = bcmp(pcVar5,"terminate",__n_01);
      if (iVar9 == 0) {
        if (this->allowRemoteControl == true) {
          if (5 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
            local_f8 = 0x37;
            pcStack_f0 = " received terminate instruction via command instruction";
            message_01._M_str = " received terminate instruction via command instruction";
            message_01._M_len = 0x37;
            name_01._M_str = (this->identifier)._M_dataplus._M_p;
            name_01._M_len = (this->identifier)._M_string_length;
            sendToLogger(this,(GlobalFederateId)(this->global_broker_id_local).gid,6,name_01,
                         message_01,false);
          }
          ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_user_disconnect);
          addActionMessage(this,(ActionMessage *)local_e8);
          ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        }
        goto LAB_0030084d;
      }
      if (__n_01 == 3) goto switchD_00300427_caseD_3;
      if (__n_01 == 9) goto LAB_00300522;
      if (__n_01 == 4) goto switchD_00300427_caseD_4;
    }
  }
  __return_storage_ptr__->first = false;
  CLI::std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&__return_storage_ptr__->second,&local_130);
LAB_0030085e:
  if (local_130.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::vector<std::string_view>>
    BrokerBase::processBaseCommands(ActionMessage& command)
{
    auto cmd = command.payload.to_string();
    auto commentLoc = cmd.find('#');
    if (commentLoc != std::string_view::npos) {
        cmd = cmd.substr(0, commentLoc - 1);
    }
    gmlc::utilities::string_viewOps::trimString(cmd);
    auto res = gmlc::utilities::string_viewOps::splitlineQuotes(
        cmd,
        " |",
        gmlc::utilities::string_viewOps::default_quote_chars,
        gmlc::utilities::string_viewOps::delimiter_compression::on);
    if (res.empty()) {
        return {true, {}};
    }
    if (res[0] == "ignore") {
    } else if (res[0] == "terminate") {
        if (allowRemoteControl) {
            LOG_SUMMARY(global_broker_id_local,
                        identifier,
                        " received terminate instruction via command instruction")
            const ActionMessage udisconnect(CMD_USER_DISCONNECT);
            addActionMessage(udisconnect);
        }
    } else if (res[0] == "echo") {
        LOG_SUMMARY(global_broker_id_local,
                    identifier,
                    " received echo command via command instruction")
        command.swapSourceDest();
        command.payload = "echo_reply";
        command.setString(targetStringLoc, command.getString(sourceStringLoc));
        command.setString(sourceStringLoc, identifier);
        addActionMessage(command);
    } else if (res[0] == "log") {
        LOG_SUMMARY(global_broker_id_local,
                    command.getString(sourceStringLoc),
                    command.payload.to_string().substr(4));
    } else if (res[0] == "logbuffer") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->getLogBuffer().enable(false);
            } else {
                mLogManager->getLogBuffer().resize(gmlc::utilities::numeric_conversion<std::size_t>(
                    res[1], LogBuffer::cDefaultBufferSize));
            }
        } else {
            mLogManager->getLogBuffer().enable(true);
        }
    } else if (res[0] == "remotelog") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->updateRemote(command.source_id, HELICS_LOG_LEVEL_NO_PRINT);
            } else {
                int newLogLevel = HELICS_LOG_LEVEL_NO_PRINT;
                if (isdigit(res[1][0]) != 0) {
                    newLogLevel =
                        gmlc::utilities::numeric_conversion<int>(res[1], HELICS_LOG_LEVEL_NO_PRINT);
                } else {
                    newLogLevel = logLevelFromString(res[1]);
                }
                mLogManager->updateRemote(command.source_id, newLogLevel);
            }
        } else {
            mLogManager->updateRemote(command.source_id, mLogManager->getConsoleLevel());
        }
        maxLogLevel.store(mLogManager->getMaxLevel());
    } else {
        return {false, res};
    }
    return {true, res};
}